

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3FreeDeferredTokens(Fts3Cursor *pCsr)

{
  Fts3DeferredToken *pFVar1;
  Fts3DeferredToken *pNext;
  Fts3DeferredToken *pDef;
  Fts3Cursor *pCsr_local;
  
  pNext = pCsr->pDeferred;
  while (pNext != (Fts3DeferredToken *)0x0) {
    pFVar1 = pNext->pNext;
    fts3PendingListDelete(pNext->pList);
    sqlite3_free(pNext);
    pNext = pFVar1;
  }
  pCsr->pDeferred = (Fts3DeferredToken *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3FreeDeferredTokens(Fts3Cursor *pCsr){
  Fts3DeferredToken *pDef;
  Fts3DeferredToken *pNext;
  for(pDef=pCsr->pDeferred; pDef; pDef=pNext){
    pNext = pDef->pNext;
    fts3PendingListDelete(pDef->pList);
    sqlite3_free(pDef);
  }
  pCsr->pDeferred = 0;
}